

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  uint enabled;
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/window.c"
                  ,0x36b,"void glfwSetWindowAttrib(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (attrib - 0x20003U < 0xb) {
    enabled = (uint)(value != 0);
    switch(attrib) {
    case 0x20003:
      if ((*(uint *)(handle + 8) != enabled) &&
         (*(uint *)(handle + 8) = enabled, *(long *)(handle + 0x48) == 0)) {
        _glfwPlatformSetWindowResizable((_GLFWwindow *)handle,enabled);
        return;
      }
      break;
    default:
      goto switchD_0011436f_caseD_20004;
    case 0x20005:
      if ((*(uint *)(handle + 0xc) != enabled) &&
         (*(uint *)(handle + 0xc) = enabled, *(long *)(handle + 0x48) == 0)) {
        _glfwPlatformSetWindowDecorated((_GLFWwindow *)handle,enabled);
        return;
      }
      break;
    case 0x20006:
      *(uint *)(handle + 0x10) = enabled;
      return;
    case 0x20007:
      if ((*(uint *)(handle + 0x14) != enabled) &&
         (*(uint *)(handle + 0x14) = enabled, *(long *)(handle + 0x48) == 0)) {
        _glfwPlatformSetWindowFloating((_GLFWwindow *)handle,enabled);
        return;
      }
      break;
    case 0x2000c:
      *(uint *)(handle + 0x18) = enabled;
      return;
    case 0x2000d:
      if (*(uint *)(handle + 0x1c) != enabled) {
        *(uint *)(handle + 0x1c) = enabled;
        _glfwPlatformSetWindowMousePassthrough((_GLFWwindow *)handle,enabled);
        return;
      }
    }
    return;
  }
switchD_0011436f_caseD_20004:
  _glfwInputError(0x10003,"Invalid window attribute 0x%08X",attrib);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    if (attrib == GLFW_AUTO_ICONIFY)
        window->autoIconify = value;
    else if (attrib == GLFW_RESIZABLE)
    {
        if (window->resizable == value)
            return;

        window->resizable = value;
        if (!window->monitor)
            _glfwPlatformSetWindowResizable(window, value);
    }
    else if (attrib == GLFW_DECORATED)
    {
        if (window->decorated == value)
            return;

        window->decorated = value;
        if (!window->monitor)
            _glfwPlatformSetWindowDecorated(window, value);
    }
    else if (attrib == GLFW_FLOATING)
    {
        if (window->floating == value)
            return;

        window->floating = value;
        if (!window->monitor)
            _glfwPlatformSetWindowFloating(window, value);
    }
    else if (attrib == GLFW_FOCUS_ON_SHOW)
        window->focusOnShow = value;
    else if (attrib == GLFW_MOUSE_PASSTHROUGH)
    {
        if (window->mousePassthrough == value)
            return;

        window->mousePassthrough = value;
        _glfwPlatformSetWindowMousePassthrough(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}